

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlXPathCompExprPtr xmlXPathTryStreamCompile(xmlXPathContextPtr ctxt,xmlChar *str)

{
  long lVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlChar **namespaces;
  long lVar4;
  xmlPatternPtr comp;
  xmlXPathCompExprPtr pxVar5;
  char *extra;
  xmlDict *dict;
  
  pxVar3 = xmlStrchr(str,'[');
  if (pxVar3 != (xmlChar *)0x0) {
    return (xmlXPathCompExprPtr)0x0;
  }
  pxVar3 = xmlStrchr(str,'(');
  if (pxVar3 != (xmlChar *)0x0) {
    return (xmlXPathCompExprPtr)0x0;
  }
  pxVar3 = xmlStrchr(str,'@');
  if (pxVar3 != (xmlChar *)0x0) {
    return (xmlXPathCompExprPtr)0x0;
  }
  pxVar3 = xmlStrchr(str,':');
  if (pxVar3 == (xmlChar *)0x0) {
    if (ctxt != (xmlXPathContextPtr)0x0) {
      iVar2 = ctxt->nsNr;
      goto LAB_001e3b5c;
    }
    dict = (xmlDict *)0x0;
LAB_001e3bb8:
    comp = xmlPatterncompile(str,dict,1,(xmlChar **)0x0);
  }
  else {
    if (ctxt == (xmlXPathContextPtr)0x0) {
      return (xmlXPathCompExprPtr)0x0;
    }
    iVar2 = ctxt->nsNr;
    if (iVar2 == 0) {
      return (xmlXPathCompExprPtr)0x0;
    }
    if (pxVar3[1] == ':') {
      return (xmlXPathCompExprPtr)0x0;
    }
LAB_001e3b5c:
    dict = ctxt->dict;
    if (iVar2 < 1) goto LAB_001e3bb8;
    namespaces = (xmlChar **)(*xmlMalloc)((ulong)(iVar2 * 2 + 2) << 3);
    if (namespaces == (xmlChar **)0x0) {
      extra = "allocating namespaces array\n";
      goto LAB_001e3c55;
    }
    iVar2 = ctxt->nsNr;
    if ((long)iVar2 < 1) {
      lVar4 = 0;
    }
    else {
      lVar4 = 0;
      do {
        lVar1 = *(long *)((long)ctxt->namespaces + lVar4 * 4);
        namespaces[lVar4] = *(xmlChar **)(lVar1 + 0x10);
        namespaces[lVar4 + 1] = *(xmlChar **)(lVar1 + 0x18);
        lVar4 = lVar4 + 2;
      } while ((long)iVar2 * 2 != lVar4);
    }
    namespaces[lVar4] = (xmlChar *)0x0;
    (namespaces + lVar4)[1] = (xmlChar *)0x0;
    comp = xmlPatterncompile(str,dict,1,namespaces);
    (*xmlFree)(namespaces);
  }
  if ((comp == (xmlPatternPtr)0x0) || (iVar2 = xmlPatternStreamable(comp), iVar2 != 1)) {
    xmlFreePattern(comp);
    return (xmlXPathCompExprPtr)0x0;
  }
  pxVar5 = xmlXPathNewCompExpr();
  if (pxVar5 != (xmlXPathCompExprPtr)0x0) {
    pxVar5->stream = comp;
    pxVar5->dict = dict;
    if (dict != (xmlDictPtr)0x0) {
      xmlDictReference(dict);
      return pxVar5;
    }
    return pxVar5;
  }
  extra = "allocating streamable expression\n";
LAB_001e3c55:
  xmlXPathErrMemory(ctxt,extra);
  return (xmlXPathCompExprPtr)0x0;
}

Assistant:

static xmlXPathCompExprPtr
xmlXPathTryStreamCompile(xmlXPathContextPtr ctxt, const xmlChar *str) {
    /*
     * Optimization: use streaming patterns when the XPath expression can
     * be compiled to a stream lookup
     */
    xmlPatternPtr stream;
    xmlXPathCompExprPtr comp;
    xmlDictPtr dict = NULL;
    const xmlChar **namespaces = NULL;
    xmlNsPtr ns;
    int i, j;

    if ((!xmlStrchr(str, '[')) && (!xmlStrchr(str, '(')) &&
        (!xmlStrchr(str, '@'))) {
	const xmlChar *tmp;

	/*
	 * We don't try to handle expressions using the verbose axis
	 * specifiers ("::"), just the simplified form at this point.
	 * Additionally, if there is no list of namespaces available and
	 *  there's a ":" in the expression, indicating a prefixed QName,
	 *  then we won't try to compile either. xmlPatterncompile() needs
	 *  to have a list of namespaces at compilation time in order to
	 *  compile prefixed name tests.
	 */
	tmp = xmlStrchr(str, ':');
	if ((tmp != NULL) &&
	    ((ctxt == NULL) || (ctxt->nsNr == 0) || (tmp[1] == ':')))
	    return(NULL);

	if (ctxt != NULL) {
	    dict = ctxt->dict;
	    if (ctxt->nsNr > 0) {
		namespaces = xmlMalloc(2 * (ctxt->nsNr + 1) * sizeof(xmlChar*));
		if (namespaces == NULL) {
		    xmlXPathErrMemory(ctxt, "allocating namespaces array\n");
		    return(NULL);
		}
		for (i = 0, j = 0; (j < ctxt->nsNr); j++) {
		    ns = ctxt->namespaces[j];
		    namespaces[i++] = ns->href;
		    namespaces[i++] = ns->prefix;
		}
		namespaces[i++] = NULL;
		namespaces[i] = NULL;
	    }
	}

	stream = xmlPatterncompile(str, dict, XML_PATTERN_XPATH, namespaces);
	if (namespaces != NULL) {
	    xmlFree((xmlChar **)namespaces);
	}
	if ((stream != NULL) && (xmlPatternStreamable(stream) == 1)) {
	    comp = xmlXPathNewCompExpr();
	    if (comp == NULL) {
		xmlXPathErrMemory(ctxt, "allocating streamable expression\n");
		return(NULL);
	    }
	    comp->stream = stream;
	    comp->dict = dict;
	    if (comp->dict)
		xmlDictReference(comp->dict);
	    return(comp);
	}
	xmlFreePattern(stream);
    }
    return(NULL);
}